

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CropResizeLayerParams::SharedDtor(CropResizeLayerParams *this)

{
  if (this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    if (this->mode_ != (SamplingMode *)0x0) {
      (*(this->mode_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0) {
      (*(this->boxindicesmode_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void CropResizeLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete mode_;
  }
  if (this != internal_default_instance()) {
    delete boxindicesmode_;
  }
}